

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_is_valid_ecode(int ecode)

{
  return (int)((ecode & 1U) == 0 && (uint)ecode < 0x29);
}

Assistant:

int nifti_is_valid_ecode( int ecode )
{
   if( ecode < NIFTI_ECODE_IGNORE  ||   /* minimum code number (0) */
       ecode > NIFTI_MAX_ECODE     ||   /* maximum code number     */
       ecode & 1 )                      /* cannot be odd           */
      return 0;

   return 1;
}